

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxRawSocket.cpp
# Opt level: O0

bool __thiscall LinuxRawSocket::setOutputInterface(LinuxRawSocket *this,string *interface_name)

{
  int iVar1;
  long in_RDI;
  bool bVar2;
  string *in_stack_00000008;
  
  bVar2 = *(int *)(in_RDI + 8) != -1;
  if (bVar2) {
    iVar1 = getInterfaceIndex((LinuxRawSocket *)interface_name,in_stack_00000008);
    *(int *)(in_RDI + 0x24) = iVar1;
  }
  return bVar2;
}

Assistant:

bool LinuxRawSocket::setOutputInterface(const std::string& interface_name)
{
    // Operation cannot complete successfully without an open socket
    if (socket_fd == -1)
    {
        return false;
    }

    // Retrieve the index of the desired interface
    output_interface.sll_ifindex = getInterfaceIndex(interface_name);

    return true;
}